

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

SpecparamDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSpecparam(Parser *this,AttrList attr,SyntaxKind parentKind)

{
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> elements;
  Token placeholder;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_01;
  Token signing;
  Token keyword_00;
  Token semi_00;
  ImplicitTypeSyntax *pIVar1;
  SpecparamDeclarationSyntax *pSVar2;
  DiagCode in_ECX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX;
  undefined8 *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token semi;
  ImplicitTypeSyntax *type;
  SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL> dims;
  VariableDimensionSyntax *dim;
  Token keyword;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffd28;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffd30;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *this_00;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd3c;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  ParserBase *in_stack_fffffffffffffd50;
  Info *pIVar4;
  undefined8 *puVar5;
  Info *pIVar6;
  ParserBase *in_stack_fffffffffffffd80;
  Parser *in_stack_fffffffffffffdf8;
  RequireItems in_stack_fffffffffffffe44;
  Token *in_stack_fffffffffffffe48;
  TokenKind in_stack_fffffffffffffe54;
  TokenKind in_stack_fffffffffffffe56;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffe58;
  ParserBase *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe78;
  AllowEmpty in_stack_fffffffffffffe80;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *local_108;
  ImplicitTypeSyntax *pIStack_100;
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> local_78 [2];
  VariableDimensionSyntax *local_38;
  Token local_30;
  DiagCode local_1c;
  
  local_1c = in_ECX;
  local_30 = ParserBase::consume(in_stack_fffffffffffffd50);
  local_38 = parseDimension(in_stack_fffffffffffffdf8);
  SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL> *)0x2fc317);
  if (local_38 != (VariableDimensionSyntax *)0x0) {
    SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)
               in_stack_fffffffffffffd30,(VariableDimensionSyntax **)in_stack_fffffffffffffd28);
  }
  Token::Token((Token *)in_stack_fffffffffffffd30);
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::copy
            (local_78,(EVP_PKEY_CTX *)*in_RDI,src);
  elements._M_ptr._4_4_ = in_stack_fffffffffffffd3c;
  elements._M_ptr._0_4_ = in_stack_fffffffffffffd38;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffd40._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
            (in_stack_fffffffffffffd30,elements);
  ParserBase::placeholderToken(in_stack_fffffffffffffd80);
  signing.info = (Info *)in_stack_fffffffffffffd50;
  signing.kind = (short)in_stack_fffffffffffffd48;
  signing._2_1_ = (char)((ulong)in_stack_fffffffffffffd48 >> 0x10);
  signing.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd48 >> 0x18);
  signing.rawLen = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  placeholder.rawLen = in_stack_fffffffffffffd3c;
  placeholder.kind = (short)in_stack_fffffffffffffd38;
  placeholder._2_1_ = (char)((uint)in_stack_fffffffffffffd38 >> 0x10);
  placeholder.numFlags.raw = (char)((uint)in_stack_fffffffffffffd38 >> 0x18);
  placeholder.info = (Info *)in_stack_fffffffffffffd40._M_extent_value;
  pIVar1 = slang::syntax::SyntaxFactory::implicitType
                     ((SyntaxFactory *)in_stack_fffffffffffffd30,signing,in_stack_fffffffffffffd28,
                      placeholder);
  Token::Token((Token *)in_stack_fffffffffffffd30);
  pIVar6 = (Info *)&stack0xfffffffffffffe80;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x2fc464);
  this_00 = (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)
            &stack0xfffffffffffffe68;
  uVar3 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isNotIdOrComma,slang::parsing::Parser::parseSpecparam(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::syntax::SyntaxKind)::__0>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe56,
             in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,local_1c,
             (anon_class_16_2_75193fd9 *)CONCAT44(0x380005,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe80);
  puVar5 = in_RDI + 0x1c;
  elements_00._M_ptr._4_4_ = in_stack_fffffffffffffd3c;
  elements_00._M_ptr._0_4_ = uVar3;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffd40._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,elements_00);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffe80,
             (EVP_PKEY_CTX *)*in_RDI,src_00);
  elements_01._M_ptr._4_4_ = in_stack_fffffffffffffd3c;
  elements_01._M_ptr._0_4_ = uVar3;
  elements_01._M_extent._M_extent_value = in_stack_fffffffffffffd40._M_extent_value;
  pIVar4 = extraout_RDX;
  slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::SeparatedSyntaxList
            (this_00,elements_01);
  keyword_00.info = pIVar4;
  keyword_00._0_8_ = pIVar1;
  semi_00.info = pIVar6;
  semi_00._0_8_ = puVar5;
  pSVar2 = slang::syntax::SyntaxFactory::specparamDeclaration
                     ((SyntaxFactory *)in_stack_fffffffffffffd40._M_extent_value,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                      CONCAT44(in_stack_fffffffffffffd3c,uVar3),keyword_00,pIStack_100,local_108,
                      semi_00);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x2fc5e4);
  SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL> *)0x2fc5f1);
  return pSVar2;
}

Assistant:

SpecparamDeclarationSyntax& Parser::parseSpecparam(AttrList attr, SyntaxKind parentKind) {
    auto keyword = consume();

    auto dim = parseDimension();
    SmallVector<VariableDimensionSyntax*> dims;
    if (dim)
        dims.push_back(dim);

    auto& type = factory.implicitType(Token(), dims.copy(alloc), placeholderToken());

    Token semi;
    SmallVector<TokenOrSyntax, 4> buffer;
    parseList<isIdentifierOrComma, isNotIdOrComma>(buffer, TokenKind::Semicolon, TokenKind::Comma,
                                                   semi, RequireItems::True,
                                                   diag::ExpectedDeclarator, [this, parentKind] {
                                                       return &parseSpecparamDeclarator(parentKind);
                                                   });

    return factory.specparamDeclaration(attr, keyword, type, buffer.copy(alloc), semi);
}